

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpMessage.h
# Opt level: O3

string * __thiscall FIX::HttpMessage::getParameter(HttpMessage *this,string *key)

{
  const_iterator cVar1;
  logic_error *this_00;
  long *plVar2;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->m_parameters)._M_t,key);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->m_parameters)._M_t._M_impl.super__Rb_tree_header)
  {
    return (string *)(cVar1._M_node + 2);
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_60,"Parameter ",key);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_60);
  local_40 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_40 == plVar3) {
    local_30 = *plVar3;
    lStack_28 = plVar2[3];
    local_40 = &local_30;
  }
  else {
    local_30 = *plVar3;
  }
  local_38 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::logic_error::logic_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

const std::string& getParameter( const std::string& key ) const
  EXCEPT ( std::logic_error )
  {
    Parameters::const_iterator find = m_parameters.find( key );
    if( find == m_parameters.end() )
      throw std::logic_error( "Parameter " + key + " not found" );
    return find->second;
  }